

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_int_&> __thiscall
kj::Table<unsigned_int,kj::HashIndex<kj::_::(anonymous_namespace)::UintHasher>>::
find<0ul,unsigned_int>
          (Table<unsigned_int,kj::HashIndex<kj::_::(anonymous_namespace)::UintHasher>> *this,
          StringPtr *params)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  uint32_t *in_RDX;
  uint uVar6;
  char *pcVar8;
  ulong uVar7;
  
  pcVar8 = (char *)0x0;
  if (params[3].content.size_ != 0) {
    pcVar2 = (params->content).ptr;
    uVar5 = _::intHash32(*in_RDX);
    pcVar3 = params[3].content.ptr;
    sVar4 = params[3].content.size_;
    uVar6 = (int)sVar4 - 1U & uVar5;
    while( true ) {
      uVar7 = (ulong)uVar6;
      iVar1 = *(int *)(pcVar3 + uVar7 * 8 + 4);
      if (iVar1 == 0) break;
      if (((iVar1 != 1) && (*(uint *)(pcVar3 + uVar7 * 8) == uVar5)) &&
         (*(uint32_t *)(pcVar2 + (ulong)(iVar1 - 2) * 4) == *in_RDX)) {
        pcVar8 = (params->content).ptr + (ulong)(iVar1 - 2) * 4;
        break;
      }
      uVar6 = (uint)(uVar7 + 1);
      if (uVar7 + 1 == sVar4) {
        uVar6 = 0;
      }
    }
  }
  *(char **)this = pcVar8;
  return (Maybe<unsigned_int_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}